

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_delay_config *
ma_delay_config_init
          (ma_delay_config *__return_storage_ptr__,ma_uint32 channels,ma_uint32 sampleRate,
          ma_uint32 delayInFrames,float decay)

{
  __return_storage_ptr__->channels = channels;
  __return_storage_ptr__->sampleRate = sampleRate;
  __return_storage_ptr__->delayInFrames = delayInFrames;
  __return_storage_ptr__->delayStart = -(uint)(decay == 0.0) & 1;
  __return_storage_ptr__->wet = 1.0;
  __return_storage_ptr__->dry = 1.0;
  __return_storage_ptr__->decay = decay;
  return __return_storage_ptr__;
}

Assistant:

MA_API ma_delay_config ma_delay_config_init(ma_uint32 channels, ma_uint32 sampleRate, ma_uint32 delayInFrames, float decay)
{
    ma_delay_config config;

    MA_ZERO_OBJECT(&config);
    config.channels      = channels;
    config.sampleRate    = sampleRate;
    config.delayInFrames = delayInFrames;
    config.delayStart    = (decay == 0) ? MA_TRUE : MA_FALSE;   /* Delay the start if it looks like we're not configuring an echo. */
    config.wet           = 1;
    config.dry           = 1;
    config.decay         = decay;

    return config;
}